

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  vector<wasm::WATParser::ScriptEntry,_std::allocator<wasm::WATParser::ScriptEntry>_> *script_00;
  string *psVar2;
  undefined1 auVar3 [16];
  Err *err_1;
  undefined1 local_300 [8];
  Result<wasm::Ok> result;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  string_view local_2a8;
  undefined1 local_298 [8];
  Lexer lexer;
  Err *err;
  Result<std::vector<wasm::WATParser::ScriptEntry,_std::allocator<wasm::WATParser::ScriptEntry>_>_>
  local_228 [8];
  Result<std::vector<wasm::WATParser::ScriptEntry,_std::allocator<wasm::WATParser::ScriptEntry>_>_>
  script;
  string local_200 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1d8;
  allocator<char> local_1b1;
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [39];
  allocator<char> local_161;
  string local_160 [32];
  Options local_140 [8];
  Options options;
  allocator<char> local_79;
  string local_78 [8];
  string infile;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> skipped;
  Name entry;
  char **argv_local;
  int argc_local;
  
  wasm::Name::Name((Name *)&skipped._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             ((long)&infile.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"-",&local_79);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_160,"wasm-shell",&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_188,"Execute .wast files",&local_189);
  wasm::Options::Options(local_140,local_160,local_188);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator(&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"INFILE",&local_1b1);
  input.field_2._8_8_ = local_78;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__0,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1d8,
             (anon_class_8_1_5a8ed95f *)((long)&input.field_2 + 8));
  wasm::Options::add_positional((string *)local_140,(Arguments)local_1b0,(function *)0x1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1d8);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  wasm::Options::parse((int)local_140,(char **)(ulong)(uint)argc);
  wasm::read_file<std::__cxx11::string>(local_200,(BinaryOption)local_78);
  auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view(local_200);
  wasm::WATParser::parseScript(local_228,auVar3._0_8_,auVar3._8_8_);
  lexer.buffer._M_str =
       (char *)wasm::
               Result<std::vector<wasm::WATParser::ScriptEntry,_std::allocator<wasm::WATParser::ScriptEntry>_>_>
               ::getErr(local_228);
  if ((string *)lexer.buffer._M_str != (string *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,(string *)lexer.buffer._M_str);
    std::operator<<(poVar1,'\n');
    exit(1);
  }
  local_2a8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_200);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  wasm::WATParser::Lexer::Lexer((Lexer *)local_298,local_2a8,&local_2d0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2d0);
  Shell::Shell((Shell *)&err_1,local_140);
  script_00 = wasm::
              Result<std::vector<wasm::WATParser::ScriptEntry,_std::allocator<wasm::WATParser::ScriptEntry>_>_>
              ::operator*(local_228);
  Shell::run((Result<wasm::Ok> *)local_300,(Shell *)&err_1,script_00);
  Shell::~Shell((Shell *)&err_1);
  psVar2 = (string *)wasm::Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_300);
  if (psVar2 != (string *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,psVar2);
    std::operator<<(poVar1,'\n');
    exit(1);
  }
  Colors::green((ostream *)&std::cerr);
  Colors::bold((ostream *)&std::cerr);
  std::operator<<((ostream *)&std::cerr,"all checks passed.\n");
  Colors::normal((ostream *)&std::cerr);
  wasm::Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_300);
  wasm::WATParser::Lexer::~Lexer((Lexer *)local_298);
  wasm::
  Result<std::vector<wasm::WATParser::ScriptEntry,_std::allocator<wasm::WATParser::ScriptEntry>_>_>
  ::~Result(local_228);
  std::__cxx11::string::~string(local_200);
  wasm::Options::~Options(local_140);
  std::__cxx11::string::~string(local_78);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             ((long)&infile.field_2 + 8));
  return 0;
}

Assistant:

int main(int argc, const char* argv[]) {
  Name entry;
  std::set<size_t> skipped;

  // Read stdin by default.
  std::string infile = "-";
  Options options("wasm-shell", "Execute .wast files");
  options.add_positional(
    "INFILE",
    Options::Arguments::One,
    [&](Options* o, const std::string& argument) { infile = argument; });
  options.parse(argc, argv);

  auto input = read_file<std::string>(infile, Flags::Text);

  // Check that we can parse the script correctly with the new parser.
  auto script = WATParser::parseScript(input);
  if (auto* err = script.getErr()) {
    std::cerr << err->msg << '\n';
    exit(1);
  }

  Lexer lexer(input);
  auto result = Shell(options).run(*script);
  if (auto* err = result.getErr()) {
    std::cerr << err->msg << '\n';
    exit(1);
  }

  Colors::green(std::cerr);
  Colors::bold(std::cerr);
  std::cerr << "all checks passed.\n";
  Colors::normal(std::cerr);
}